

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

void fill_window(deflate_state *s)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uint uVar4;
  Bytef *pBVar5;
  Posf *pPVar6;
  byte bVar7;
  uint uVar8;
  uInt uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ushort *puVar13;
  ushort uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t __n;
  ulg uVar17;
  ulong uVar18;
  bool bVar19;
  uint uVar20;
  
  uVar4 = s->w_size;
  uVar11 = s->lookahead;
  while( true ) {
    uVar20 = s->strstart;
    uVar11 = (int)s->window_size - (uVar11 + uVar20);
    if (s->w_size + (uVar4 - 0x106) <= uVar20) {
      memcpy(s->window,s->window + uVar4,(ulong)(uVar4 - uVar11));
      uVar1 = s->strstart;
      uVar2 = s->match_start;
      uVar20 = uVar1 - uVar4;
      s->strstart = uVar20;
      s->match_start = uVar2 - uVar4;
      s->block_start = s->block_start - (ulong)uVar4;
      if (uVar20 < s->insert) {
        s->insert = uVar20;
      }
      uVar12 = s->w_size;
      uVar10 = (ulong)s->hash_size;
      puVar13 = s->head + uVar10;
      do {
        puVar13 = puVar13 + -1;
        uVar14 = *puVar13 - (short)uVar12;
        if (*puVar13 < uVar12) {
          uVar14 = 0;
        }
        *puVar13 = uVar14;
        uVar8 = (int)uVar10 - 1;
        uVar10 = (ulong)uVar8;
      } while (uVar8 != 0);
      puVar13 = s->prev + uVar12;
      uVar8 = uVar12;
      do {
        puVar13 = puVar13 + -1;
        uVar14 = *puVar13 - (short)uVar12;
        if (*puVar13 < uVar12) {
          uVar14 = 0;
        }
        *puVar13 = uVar14;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
      uVar11 = uVar11 + uVar4;
    }
    if (s->strm->avail_in == 0) break;
    uVar11 = read_buf(s->strm,s->window + (ulong)s->lookahead + (ulong)uVar20,uVar11);
    uVar11 = uVar11 + s->lookahead;
    s->lookahead = uVar11;
    uVar9 = s->insert;
    if (2 < uVar9 + uVar11) {
      uVar12 = s->strstart - uVar9;
      uVar10 = (ulong)uVar12;
      pBVar5 = s->window;
      bVar3 = pBVar5[uVar10];
      s->ins_h = (uint)bVar3;
      bVar7 = (byte)s->hash_shift;
      uVar20 = s->hash_mask;
      uVar12 = ((uint)pBVar5[uVar12 + 1] ^ (uint)bVar3 << (bVar7 & 0x1f)) & uVar20;
      s->ins_h = uVar12;
      do {
        bVar19 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar19) break;
        uVar8 = (uint)uVar10;
        uVar12 = ((uint)pBVar5[uVar8 + 2] ^ uVar12 << (bVar7 & 0x1f)) & uVar20;
        s->ins_h = uVar12;
        pPVar6 = s->head;
        s->prev[s->w_mask & uVar8] = pPVar6[uVar12];
        pPVar6[uVar12] = (Posf)uVar10;
        uVar10 = (ulong)(uVar8 + 1);
        s->insert = uVar9;
      } while (2 < uVar11 + uVar9);
    }
    if ((0x105 < uVar11) || (s->strm->avail_in == 0)) break;
  }
  uVar10 = s->high_water;
  uVar16 = s->window_size;
  uVar18 = uVar16 - uVar10;
  if (uVar10 <= uVar16 && uVar18 != 0) {
    uVar15 = (ulong)s->lookahead + (ulong)s->strstart;
    if (uVar10 < uVar15) {
      __n = uVar16 - uVar15;
      if (0x101 < __n) {
        __n = 0x102;
      }
      memset(s->window + uVar15,0,__n);
      uVar17 = __n + uVar15;
    }
    else {
      uVar16 = (uVar15 + 0x102) - uVar10;
      if (uVar15 + 0x102 < uVar10 || uVar16 == 0) {
        return;
      }
      if (uVar16 < uVar18) {
        uVar18 = uVar16;
      }
      memset(s->window + uVar10,0,uVar18 & 0xffffffff);
      uVar17 = uVar18 + s->high_water;
    }
    s->high_water = uVar17;
  }
  return;
}

Assistant:

local void fill_window(s)
    deflate_state *s;
{
    unsigned n;
    unsigned more;    /* Amount of free space at the end of the window. */
    uInt wsize = s->w_size;

    Assert(s->lookahead < MIN_LOOKAHEAD, "already enough lookahead");

    do {
        more = (unsigned)(s->window_size -(ulg)s->lookahead -(ulg)s->strstart);

        /* Deal with !@#$% 64K limit: */
        if (sizeof(int) <= 2) {
            if (more == 0 && s->strstart == 0 && s->lookahead == 0) {
                more = wsize;

            } else if (more == (unsigned)(-1)) {
                /* Very unlikely, but possible on 16 bit machine if
                 * strstart == 0 && lookahead == 1 (input done a byte at time)
                 */
                more--;
            }
        }

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (s->strstart >= wsize+MAX_DIST(s)) {

            zmemcpy(s->window, s->window+wsize, (unsigned)wsize - more);
            s->match_start -= wsize;
            s->strstart    -= wsize; /* we now have strstart >= MAX_DIST */
            s->block_start -= (long) wsize;
            if (s->insert > s->strstart)
                s->insert = s->strstart;
            slide_hash(s);
            more += wsize;
        }
        if (s->strm->avail_in == 0) break;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the BIG_MEM or MMAP case (not yet supported),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + s->lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = read_buf(s->strm, s->window + s->strstart + s->lookahead, more);
        s->lookahead += n;

        /* Initialize the hash value now that we have some input: */
        if (s->lookahead + s->insert >= MIN_MATCH) {
            uInt str = s->strstart - s->insert;
            s->ins_h = s->window[str];
            UPDATE_HASH(s, s->ins_h, s->window[str + 1]);
#if MIN_MATCH != 3
            Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
            while (s->insert) {
                UPDATE_HASH(s, s->ins_h, s->window[str + MIN_MATCH-1]);
#ifndef FASTEST
                s->prev[str & s->w_mask] = s->head[s->ins_h];
#endif
                s->head[s->ins_h] = (Pos)str;
                str++;
                s->insert--;
                if (s->lookahead + s->insert < MIN_MATCH)
                    break;
            }
        }
        /* If the whole input has less than MIN_MATCH bytes, ins_h is garbage,
         * but this is not important since only literal bytes will be emitted.
         */

    } while (s->lookahead < MIN_LOOKAHEAD && s->strm->avail_in != 0);

    /* If the WIN_INIT bytes after the end of the current data have never been
     * written, then zero those bytes in order to avoid memory check reports of
     * the use of uninitialized (or uninitialised as Julian writes) bytes by
     * the longest match routines.  Update the high water mark for the next
     * time through here.  WIN_INIT is set to MAX_MATCH since the longest match
     * routines allow scanning to strstart + MAX_MATCH, ignoring lookahead.
     */
    if (s->high_water < s->window_size) {
        ulg curr = s->strstart + (ulg)(s->lookahead);
        ulg init;

        if (s->high_water < curr) {
            /* Previous high water mark below current data -- zero WIN_INIT
             * bytes or up to end of window, whichever is less.
             */
            init = s->window_size - curr;
            if (init > WIN_INIT)
                init = WIN_INIT;
            zmemzero(s->window + curr, (unsigned)init);
            s->high_water = curr + init;
        }
        else if (s->high_water < (ulg)curr + WIN_INIT) {
            /* High water mark at or above current data, but below current data
             * plus WIN_INIT -- zero out to current data plus WIN_INIT, or up
             * to end of window, whichever is less.
             */
            init = (ulg)curr + WIN_INIT - s->high_water;
            if (init > s->window_size - s->high_water)
                init = s->window_size - s->high_water;
            zmemzero(s->window + s->high_water, (unsigned)init);
            s->high_water += init;
        }
    }

    Assert((ulg)s->strstart <= s->window_size - MIN_LOOKAHEAD,
           "not enough room for search");
}